

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_write_alotof_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  __off64_t _Var6;
  undefined8 uVar7;
  char *pcVar8;
  long unaff_R12;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  uv_buf_t uVar14;
  undefined1 auStack_82 [2];
  code *pcStack_80;
  undefined8 uStack_78;
  long lStack_68;
  void *pvStack_60;
  long lStack_58;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0xd4310;
  pvVar4 = malloc(0xd4310);
  if (pvVar4 == (void *)0x0) {
LAB_00158b56:
    fs_write_alotof_bufs_cold_18();
LAB_00158b5b:
    fs_write_alotof_bufs_cold_1();
LAB_00158b60:
    fs_write_alotof_bufs_cold_2();
LAB_00158b65:
    fs_write_alotof_bufs_cold_3();
LAB_00158b6a:
    fs_write_alotof_bufs_cold_4();
LAB_00158b6f:
    fs_write_alotof_bufs_cold_17();
LAB_00158b74:
    fs_write_alotof_bufs_cold_5();
LAB_00158b79:
    fs_write_alotof_bufs_cold_6();
LAB_00158b7e:
    fs_write_alotof_bufs_cold_7();
LAB_00158b83:
    fs_write_alotof_bufs_cold_8();
LAB_00158b88:
    fs_write_alotof_bufs_cold_9();
LAB_00158b8d:
    fs_write_alotof_bufs_cold_10();
LAB_00158b92:
    fs_write_alotof_bufs_cold_12();
LAB_00158b97:
    fs_write_alotof_bufs_cold_13();
LAB_00158b9c:
    fs_write_alotof_bufs_cold_14();
LAB_00158ba1:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158b5b;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b60;
    uv_fs_req_cleanup(&open_req1);
    lVar11 = 8;
    do {
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar4 + lVar11 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar4 + lVar11) = auVar13._8_8_;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar4,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158b65;
    if (write_req.result != 0xac67d) goto LAB_00158b6a;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0xac67d;
    pvVar5 = malloc(0xac67d);
    if (pvVar5 == (void *)0x0) goto LAB_00158b6f;
    lVar11 = 8;
    pvVar12 = pvVar5;
    do {
      auVar13 = uv_buf_init(pvVar12,0xd);
      *(long *)((long)pvVar4 + lVar11 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar4 + lVar11) = auVar13._8_8_;
      lVar11 = lVar11 + 0x10;
      pvVar12 = (void *)((long)pvVar12 + 0xd);
    } while (lVar11 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar2 != 0) goto LAB_00158b74;
    if (close_req.result != 0) goto LAB_00158b79;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158b7e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b83;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar4,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158b88;
    if (read_req.result != 0x3400) goto LAB_00158b8d;
    unaff_R12 = 0;
    do {
      pcVar8 = (char *)((long)pvVar5 + unaff_R12);
      iVar2 = strncmp(pcVar8,test_buf,0xd);
      iVar3 = (int)pcVar8;
      if (iVar2 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158b56;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar5);
    iVar3 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00158b92;
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_00158b97;
    if (read_req.result != 0) goto LAB_00158b9c;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158ba1;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar4);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar3);
  fs_write_alotof_bufs_with_offset(iVar3);
  pvVar4 = (void *)uv_default_loop();
  uv_walk(pvVar4,close_walk_cb,0);
  uv_run(pvVar4,0);
  uVar7 = uv_default_loop();
  iVar3 = uv_loop_close(uVar7);
  if (iVar3 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_80 = (code *)0x158c0d;
  pvStack_60 = pvVar4;
  lStack_58 = unaff_R12;
  unlink("test_file");
  pcStack_80 = (code *)0x158c12;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_80 = (code *)0x158c23;
  pvVar5 = malloc(0xd4310);
  if (pvVar5 == (void *)0x0) {
LAB_00158f6f:
    pvVar5 = pvVar4;
    pcStack_80 = (code *)0x158f74;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158f74:
    pcStack_80 = (code *)0x158f79;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158f79:
    pcStack_80 = (code *)0x158f7e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158f7e:
    pcStack_80 = (code *)0x158f83;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158f83:
    pcStack_80 = (code *)0x158f88;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158f88:
    pcStack_80 = (code *)0x158f8d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158f8d:
    pcStack_80 = (code *)0x158f92;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158f92:
    pcStack_80 = (code *)0x158f97;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158f97:
    pcStack_80 = (code *)0x158f9c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158f9c:
    pcStack_80 = (code *)0x158fa1;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158fa1:
    pcStack_80 = (code *)0x158fa6;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158fa6:
    pcStack_80 = (code *)0x158fab;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158fab:
    pcStack_80 = (code *)0x158fb0;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158fb0:
    pcStack_80 = (code *)0x158fb5;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158fb5:
    pcStack_80 = (code *)0x158fba;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_80 = (code *)0x158c52;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158f74;
    if (open_req1.result._4_4_ < 0) goto LAB_00158f79;
    pcStack_80 = (code *)0x158c74;
    uv_fs_req_cleanup(&open_req1);
    pcStack_80 = (code *)0x158c85;
    uVar14 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_78 = 0;
    pcStack_80 = (code *)0x158cc3;
    iov = uVar14;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 10) goto LAB_00158f7e;
    if (write_req.result != 10) goto LAB_00158f83;
    pcStack_80 = (code *)0x158ce8;
    uv_fs_req_cleanup(&write_req);
    lVar11 = 8;
    do {
      pcStack_80 = (code *)0x158d02;
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar5 + lVar11 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar5 + lVar11) = auVar13._8_8_;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    uStack_78 = 0;
    pcStack_80 = (code *)0x158d43;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar5,0xd431,10);
    if (iVar3 < 0) goto LAB_00158f88;
    if (write_req.result != 0xac67d) goto LAB_00158f8d;
    pcStack_80 = (code *)0x158d68;
    uv_fs_req_cleanup(&write_req);
    pcStack_80 = (code *)0x158d72;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00158f92;
    lVar11 = 8;
    pcVar9 = pcVar8;
    do {
      pcStack_80 = (code *)0x158d94;
      auVar13 = uv_buf_init(pcVar9,0xd);
      *(long *)((long)pvVar5 + lVar11 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar5 + lVar11) = auVar13._8_8_;
      lVar11 = lVar11 + 0x10;
      pcVar9 = pcVar9 + 0xd;
    } while (lVar11 != 0xd4318);
    uStack_78 = 0;
    pcStack_80 = (code *)0x158dd6;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar5,0xd431,10);
    if (iVar3 < 0) goto LAB_00158f97;
    lStack_68 = 10;
    lVar11 = 0xd;
    if (iVar3 != 0xd) {
      lVar11 = 0x3400;
    }
    if (read_req.result != lVar11) goto LAB_00158f9c;
    pcVar9 = pcVar8;
    uVar10 = 0;
    do {
      pcStack_80 = (code *)0x158e20;
      iVar2 = strncmp(pcVar9,test_buf,0xd);
      if (iVar2 != 0) {
        pcStack_80 = (code *)0x158f6f;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar4 = pvVar5;
        goto LAB_00158f6f;
      }
      if (iVar3 == 0xd) break;
      pcVar9 = pcVar9 + 0xd;
      bVar1 = uVar10 < 0x3ff;
      uVar10 = uVar10 + 1;
    } while (bVar1);
    pcStack_80 = (code *)0x158e4d;
    uv_fs_req_cleanup(&read_req);
    pcStack_80 = (code *)0x158e55;
    free(pcVar8);
    pcStack_80 = (code *)0x158e6c;
    iVar3 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar11 = lStack_68;
    if (iVar3 != 0) goto LAB_00158fa1;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_68) goto LAB_00158fa6;
    pcStack_80 = (code *)0x158ea0;
    uv_fs_req_cleanup(&stat_req);
    pcStack_80 = (code *)0x158eb1;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_78 = 0;
    pcStack_80 = (code *)0x158ef2;
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar11 + write_req.result);
    if (iVar3 != 0) goto LAB_00158fab;
    if (read_req.result != 0) goto LAB_00158fb0;
    pcStack_80 = (code *)0x158f14;
    uv_fs_req_cleanup(&read_req);
    pcStack_80 = (code *)0x158f2a;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158fb5;
    if (close_req.result == 0) {
      pcStack_80 = (code *)0x158f48;
      uv_fs_req_cleanup(&close_req);
      pcStack_80 = (code *)0x158f54;
      unlink("test_file");
      free(pvVar5);
      return;
    }
  }
  pcStack_80 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_80 = (code *)pvVar5;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar3 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar3 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00159131;
    iVar3 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar3 < 0) goto LAB_00159136;
    uv_fs_req_cleanup(&open_req1);
    uVar14 = (uv_buf_t)uv_buf_init(auStack_82,2);
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar3 != -0x15) goto LAB_0015913b;
    uv_fs_req_cleanup(&read_req);
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      uVar7 = uv_default_loop();
      iVar3 = uv_loop_close(uVar7);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_00159145;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00159131:
    run_test_fs_read_dir_cold_2();
LAB_00159136:
    run_test_fs_read_dir_cold_3();
LAB_0015913b:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159145:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}